

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize_ssse3.c
# Opt level: O2

void aom_quantize_b_64x64_ssse3
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  short *psVar1;
  tran_low_t *ptVar2;
  short *psVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ulong uVar12;
  tran_low_t *ptVar13;
  ushort uVar14;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar24;
  ushort uVar26;
  ushort uVar28;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ushort uVar23;
  ushort uVar25;
  ushort uVar27;
  ushort uVar29;
  undefined1 auVar18 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar36 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [12];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar50 [16];
  ushort uVar55;
  ushort uVar56;
  ushort uVar57;
  undefined1 in_XMM5 [16];
  undefined1 auVar54 [16];
  ushort uVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  short sVar67;
  short sVar69;
  short sVar70;
  short sVar71;
  short sVar72;
  short sVar73;
  short sVar74;
  short sVar75;
  undefined1 auVar68 [16];
  short sVar77;
  short sVar78;
  undefined1 auVar76 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  __m128i qcoeff;
  __m128i qcoeff_00;
  __m128i qcoeff_01;
  __m128i qcoeff_02;
  __m128i dequant;
  __m128i dequant_00;
  __m128i dequant_01;
  __m128i dequant_02;
  __m128i zero;
  __m128i zero_00;
  __m128i zero_01;
  __m128i zero_02;
  tran_low_t *dqcoeff;
  short local_a8;
  short sStack_a6;
  short sStack_a4;
  short sStack_a2;
  short sStack_a0;
  short sStack_9e;
  short sStack_9c;
  short sStack_9a;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  longlong extraout_RDX;
  int16_t *extraout_RDX_00;
  longlong extraout_RDX_01;
  int16_t *extraout_RDX_02;
  short sVar15;
  short sVar30;
  undefined1 auVar33 [16];
  undefined1 auVar37 [16];
  undefined1 auVar34 [16];
  undefined1 auVar38 [16];
  undefined1 auVar35 [16];
  undefined1 auVar39 [16];
  undefined1 auVar49 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  
  auVar64 = *(undefined1 (*) [16])quant_ptr;
  auVar31 = *(undefined1 (*) [16])dequant_ptr;
  auVar66 = *(undefined1 (*) [16])quant_shift_ptr;
  uVar22 = (ushort)(zbin_ptr[4] + 2U) >> 2;
  uVar24 = (ushort)(zbin_ptr[5] + 2U) >> 2;
  uVar26 = (ushort)(zbin_ptr[6] + 2U) >> 2;
  uVar28 = (ushort)(zbin_ptr[7] + 2U) >> 2;
  auVar43._0_2_ = (ushort)(*round_ptr + 2U) >> 2;
  auVar43._2_2_ = (ushort)(round_ptr[1] + 2U) >> 2;
  auVar43._4_2_ = (ushort)(round_ptr[2] + 2U) >> 2;
  auVar43._6_2_ = (ushort)(round_ptr[3] + 2U) >> 2;
  auVar43._8_2_ = (ushort)(round_ptr[4] + 2U) >> 2;
  auVar43._10_2_ = (ushort)(round_ptr[5] + 2U) >> 2;
  auVar60._12_2_ = (ushort)(round_ptr[6] + 2U) >> 2;
  auVar60._0_12_ = auVar43;
  auVar60._14_2_ = (ushort)(round_ptr[7] + 2U) >> 2;
  auVar81._8_4_ = 0xffffffff;
  auVar81._0_8_ = 0xffffffffffffffff;
  auVar81._12_4_ = 0xffffffff;
  auVar41 = packssdw(*(undefined1 (*) [16])coeff_ptr,*(undefined1 (*) [16])(coeff_ptr + 4));
  auVar47 = packssdw(*(undefined1 (*) [16])(coeff_ptr + 8),*(undefined1 (*) [16])(coeff_ptr + 0xc));
  auVar62 = pabsw(in_XMM7,auVar41);
  auVar54 = pabsw(in_XMM5,auVar47);
  auVar79._0_2_ = -(ushort)(auVar62._0_2_ < (short)((ushort)(*zbin_ptr + 2U) >> 2));
  auVar79._2_2_ = -(ushort)(auVar62._2_2_ < (short)((ushort)(zbin_ptr[1] + 2U) >> 2));
  auVar79._4_2_ = -(ushort)(auVar62._4_2_ < (short)((ushort)(zbin_ptr[2] + 2U) >> 2));
  auVar79._6_2_ = -(ushort)(auVar62._6_2_ < (short)((ushort)(zbin_ptr[3] + 2U) >> 2));
  auVar79._8_2_ = -(ushort)(auVar62._8_2_ < (short)uVar22);
  auVar79._10_2_ = -(ushort)(auVar62._10_2_ < (short)uVar24);
  auVar79._12_2_ = -(ushort)(auVar62._12_2_ < (short)uVar26);
  auVar79._14_2_ = -(ushort)(auVar62._14_2_ < (short)uVar28);
  auVar81 = auVar79 ^ auVar81;
  sVar67 = uVar22 - 1;
  sVar69 = uVar24 - 1;
  sVar70 = uVar26 - 1;
  sVar71 = uVar28 - 1;
  sVar72 = uVar22 - 1;
  sVar73 = uVar24 - 1;
  sVar74 = uVar26 - 1;
  sVar75 = uVar28 - 1;
  uVar22 = (ushort)(sVar67 < auVar54._0_2_);
  auVar82._0_2_ = -uVar22;
  uVar24 = (ushort)(sVar69 < auVar54._2_2_);
  auVar82._2_2_ = -uVar24;
  uVar26 = (ushort)(sVar70 < auVar54._4_2_);
  auVar82._4_2_ = -uVar26;
  uVar28 = (ushort)(sVar71 < auVar54._6_2_);
  auVar82._6_2_ = -uVar28;
  uVar55 = (ushort)(sVar72 < auVar54._8_2_);
  auVar82._8_2_ = -uVar55;
  uVar56 = (ushort)(sVar73 < auVar54._10_2_);
  auVar82._10_2_ = -uVar56;
  uVar57 = (ushort)(sVar74 < auVar54._12_2_);
  auVar82._12_2_ = -uVar57;
  uVar58 = (ushort)(sVar75 < auVar54._14_2_);
  auVar82._14_2_ = -uVar58;
  auVar59 = auVar82 | auVar81;
  local_68._8_4_ = auVar43._8_4_;
  local_68._12_4_ = auVar60._12_4_;
  local_78._0_8_ = auVar64._8_8_;
  local_88._0_8_ = auVar66._8_8_;
  dqcoeff = auVar31._8_8_;
  if ((((((((((((((((auVar59 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar59 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar59 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar59 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar59 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar59 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar59 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar59 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar59 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar59 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar59 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar59 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar59 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar59 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar59 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar59[0xf]) {
    uVar22 = 0;
    uVar24 = 0;
    uVar26 = 0;
    uVar28 = 0;
    uVar55 = 0;
    uVar56 = 0;
    uVar57 = 0;
    uVar58 = 0;
    *(undefined1 (*) [16])(qcoeff_ptr + 0xc) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(qcoeff_ptr + 8) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(qcoeff_ptr + 4) = (undefined1  [16])0x0;
    qcoeff_ptr[0] = 0;
    qcoeff_ptr[1] = 0;
    qcoeff_ptr[2] = 0;
    qcoeff_ptr[3] = 0;
    auVar41._4_4_ = local_68._12_4_;
    auVar41._0_4_ = local_68._8_4_;
    auVar41._8_4_ = local_68._8_4_;
    auVar41._12_4_ = local_68._12_4_;
    auVar31._8_4_ = auVar64._8_4_;
    auVar31._0_8_ = local_78._0_8_;
    auVar31._12_4_ = auVar64._12_4_;
    local_88._8_4_ = auVar66._8_4_;
    local_88._12_4_ = auVar66._12_4_;
    *(undefined1 (*) [16])(dqcoeff_ptr + 0xc) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(dqcoeff_ptr + 8) = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(dqcoeff_ptr + 4) = (undefined1  [16])0x0;
    dqcoeff_ptr[0] = 0;
    dqcoeff_ptr[1] = 0;
    dqcoeff_ptr[2] = 0;
    dqcoeff_ptr[3] = 0;
    local_78 = auVar31;
    local_68 = auVar41;
  }
  else {
    auVar59 = paddsw(auVar62,auVar60);
    auVar60 = pmulhw(auVar59,auVar64);
    auVar61._0_2_ = auVar60._0_2_ + auVar59._0_2_;
    auVar61._2_2_ = auVar60._2_2_ + auVar59._2_2_;
    auVar61._4_2_ = auVar60._4_2_ + auVar59._4_2_;
    auVar61._6_2_ = auVar60._6_2_ + auVar59._6_2_;
    auVar61._8_2_ = auVar60._8_2_ + auVar59._8_2_;
    auVar61._10_2_ = auVar60._10_2_ + auVar59._10_2_;
    auVar61._12_2_ = auVar60._12_2_ + auVar59._12_2_;
    auVar61._14_2_ = auVar60._14_2_ + auVar59._14_2_;
    sVar77 = auVar66._8_2_;
    sVar15 = auVar66._10_2_;
    sVar30 = auVar66._12_2_;
    sVar78 = auVar66._14_2_;
    auVar60 = pmulhw(auVar61,auVar66);
    auVar63._0_2_ = (ushort)(auVar61._0_2_ * auVar66._0_2_) >> 0xe;
    auVar63._2_2_ = (ushort)(auVar61._2_2_ * auVar66._2_2_) >> 0xe;
    auVar63._4_2_ = (ushort)(auVar61._4_2_ * auVar66._4_2_) >> 0xe;
    auVar63._6_2_ = (ushort)(auVar61._6_2_ * auVar66._6_2_) >> 0xe;
    auVar63._8_2_ = (ushort)(auVar61._8_2_ * sVar77) >> 0xe;
    auVar63._10_2_ = (ushort)(auVar61._10_2_ * sVar15) >> 0xe;
    auVar63._12_2_ = (ushort)(auVar61._12_2_ * sVar30) >> 0xe;
    auVar63._14_2_ = (ushort)(auVar61._14_2_ * sVar78) >> 0xe;
    auVar59 = psllw(auVar60,2);
    local_68._4_4_ = local_68._12_4_;
    local_68._0_4_ = local_68._8_4_;
    auVar60 = paddsw(auVar54,local_68);
    local_78._8_4_ = auVar64._8_4_;
    local_78._12_4_ = auVar64._12_4_;
    auVar64 = pmulhw(auVar60,local_78);
    auVar65._0_2_ = auVar64._0_2_ + auVar60._0_2_;
    auVar65._2_2_ = auVar64._2_2_ + auVar60._2_2_;
    auVar65._4_2_ = auVar64._4_2_ + auVar60._4_2_;
    auVar65._6_2_ = auVar64._6_2_ + auVar60._6_2_;
    auVar65._8_2_ = auVar64._8_2_ + auVar60._8_2_;
    auVar65._10_2_ = auVar64._10_2_ + auVar60._10_2_;
    auVar65._12_2_ = auVar64._12_2_ + auVar60._12_2_;
    auVar65._14_2_ = auVar64._14_2_ + auVar60._14_2_;
    local_88._8_4_ = auVar66._8_4_;
    local_88._12_4_ = auVar66._12_4_;
    auVar64 = pmulhw(auVar65,local_88);
    auVar54._0_2_ = (ushort)(auVar65._0_2_ * sVar77) >> 0xe;
    auVar54._2_2_ = (ushort)(auVar65._2_2_ * sVar15) >> 0xe;
    auVar54._4_2_ = (ushort)(auVar65._4_2_ * sVar30) >> 0xe;
    auVar54._6_2_ = (ushort)(auVar65._6_2_ * sVar78) >> 0xe;
    auVar54._8_2_ = (ushort)(auVar65._8_2_ * sVar77) >> 0xe;
    auVar54._10_2_ = (ushort)(auVar65._10_2_ * sVar15) >> 0xe;
    auVar54._12_2_ = (ushort)(auVar65._12_2_ * sVar30) >> 0xe;
    auVar54._14_2_ = (ushort)(auVar65._14_2_ * sVar78) >> 0xe;
    auVar66 = psllw(auVar64,2);
    auVar64 = psignw(auVar59 | auVar63,auVar41);
    auVar54 = psignw(auVar66 | auVar54,auVar47);
    auVar64 = ~auVar79 & auVar64;
    auVar54 = auVar54 & auVar82;
    auVar66 = psraw(auVar64,0xf);
    auVar59._0_12_ = auVar64._0_12_;
    auVar59._12_2_ = auVar64._6_2_;
    auVar59._14_2_ = auVar66._6_2_;
    auVar62._12_4_ = auVar59._12_4_;
    auVar62._0_10_ = auVar64._0_10_;
    auVar62._10_2_ = auVar66._4_2_;
    auVar49._10_6_ = auVar62._10_6_;
    auVar49._0_8_ = auVar64._0_8_;
    auVar49._8_2_ = auVar64._4_2_;
    auVar48._8_8_ = auVar49._8_8_;
    auVar48._6_2_ = auVar66._2_2_;
    auVar48._4_2_ = auVar64._2_2_;
    auVar48._0_2_ = auVar64._0_2_;
    auVar48._2_2_ = auVar66._0_2_;
    *(undefined1 (*) [16])qcoeff_ptr = auVar48;
    *(short *)(qcoeff_ptr + 4) = auVar64._8_2_;
    *(short *)((long)qcoeff_ptr + 0x12) = auVar66._8_2_;
    *(short *)(qcoeff_ptr + 5) = auVar64._10_2_;
    *(short *)((long)qcoeff_ptr + 0x16) = auVar66._10_2_;
    *(short *)(qcoeff_ptr + 6) = auVar64._12_2_;
    *(short *)((long)qcoeff_ptr + 0x1a) = auVar66._12_2_;
    *(short *)(qcoeff_ptr + 7) = auVar64._14_2_;
    *(short *)((long)qcoeff_ptr + 0x1e) = auVar66._14_2_;
    auVar66 = psraw(auVar54,0xf);
    auVar53._0_12_ = auVar54._0_12_;
    auVar53._12_2_ = auVar54._6_2_;
    auVar53._14_2_ = auVar66._6_2_;
    auVar52._12_4_ = auVar53._12_4_;
    auVar52._0_10_ = auVar54._0_10_;
    auVar52._10_2_ = auVar66._4_2_;
    auVar51._10_6_ = auVar52._10_6_;
    auVar51._0_8_ = auVar54._0_8_;
    auVar51._8_2_ = auVar54._4_2_;
    auVar50._8_8_ = auVar51._8_8_;
    auVar50._6_2_ = auVar66._2_2_;
    auVar50._4_2_ = auVar54._2_2_;
    auVar50._0_2_ = auVar54._0_2_;
    auVar50._2_2_ = auVar66._0_2_;
    *(undefined1 (*) [16])(qcoeff_ptr + 8) = auVar50;
    *(short *)(qcoeff_ptr + 0xc) = auVar54._8_2_;
    *(short *)((long)qcoeff_ptr + 0x32) = auVar66._8_2_;
    *(short *)(qcoeff_ptr + 0xd) = auVar54._10_2_;
    *(short *)((long)qcoeff_ptr + 0x36) = auVar66._10_2_;
    *(short *)(qcoeff_ptr + 0xe) = auVar54._12_2_;
    *(short *)((long)qcoeff_ptr + 0x3a) = auVar66._12_2_;
    *(short *)(qcoeff_ptr + 0xf) = auVar54._14_2_;
    *(short *)((long)qcoeff_ptr + 0x3e) = auVar66._14_2_;
    qcoeff[1] = n_coeffs;
    qcoeff[0] = (longlong)dqcoeff_ptr;
    dequant[1] = (longlong)round_ptr;
    dequant[0] = (longlong)zbin_ptr;
    zero[1] = (longlong)quant_shift_ptr;
    zero[0] = (longlong)quant_ptr;
    calculate_dqcoeff_and_store_64x64(qcoeff,dequant,zero,auVar31._0_8_);
    dqcoeff = (tran_low_t *)CONCAT44(auVar31._4_4_,auVar31._8_4_);
    qcoeff_00[1] = n_coeffs;
    qcoeff_00[0] = (longlong)(dqcoeff_ptr + 8);
    dequant_00[1] = (longlong)round_ptr;
    dequant_00[0] = extraout_RDX;
    zero_00[1] = (longlong)quant_shift_ptr;
    zero_00[0] = (longlong)quant_ptr;
    calculate_dqcoeff_and_store_64x64(qcoeff_00,dequant_00,zero_00,dqcoeff);
    local_a8 = auVar81._0_2_;
    sStack_a6 = auVar81._2_2_;
    sStack_a4 = auVar81._4_2_;
    sStack_a2 = auVar81._6_2_;
    sStack_a0 = auVar81._8_2_;
    sStack_9e = auVar81._10_2_;
    sStack_9c = auVar81._12_2_;
    sStack_9a = auVar81._14_2_;
    auVar66._0_2_ = *iscan - local_a8;
    auVar66._2_2_ = iscan[1] - sStack_a6;
    auVar66._4_2_ = iscan[2] - sStack_a4;
    auVar66._6_2_ = iscan[3] - sStack_a2;
    auVar66._8_2_ = iscan[4] - sStack_a0;
    auVar66._10_2_ = iscan[5] - sStack_9e;
    auVar66._12_2_ = iscan[6] - sStack_9c;
    auVar66._14_2_ = iscan[7] - sStack_9a;
    auVar31._0_2_ = iscan[8] + uVar22;
    auVar31._2_2_ = iscan[9] + uVar24;
    auVar31._4_2_ = iscan[10] + uVar26;
    auVar31._6_2_ = iscan[0xb] + uVar28;
    auVar31._8_2_ = iscan[0xc] + uVar55;
    auVar31._10_2_ = iscan[0xd] + uVar56;
    auVar31._12_2_ = iscan[0xe] + uVar57;
    auVar31._14_2_ = iscan[0xf] + uVar58;
    auVar41 = (undefined1  [16])0x0;
    auVar47._0_2_ = -(ushort)(auVar48._0_2_ == 0);
    auVar47._2_2_ = -(ushort)(auVar64._2_2_ == 0);
    auVar47._4_2_ = -(ushort)(auVar64._4_2_ == 0);
    auVar47._6_2_ = -(ushort)(auVar64._6_2_ == 0);
    auVar47._8_2_ = -(ushort)(auVar64._8_2_ == 0);
    auVar47._10_2_ = -(ushort)(auVar64._10_2_ == 0);
    auVar47._12_2_ = -(ushort)(auVar64._12_2_ == 0);
    auVar47._14_2_ = -(ushort)(auVar64._14_2_ == 0);
    auVar60 = ~auVar47 & auVar66;
    auVar64._0_2_ = -(ushort)(auVar50._0_2_ == 0);
    auVar64._2_2_ = -(ushort)(auVar54._2_2_ == 0);
    auVar64._4_2_ = -(ushort)(auVar54._4_2_ == 0);
    auVar64._6_2_ = -(ushort)(auVar54._6_2_ == 0);
    auVar64._8_2_ = -(ushort)(auVar54._8_2_ == 0);
    auVar64._10_2_ = -(ushort)(auVar54._10_2_ == 0);
    auVar64._12_2_ = -(ushort)(auVar54._12_2_ == 0);
    auVar64._14_2_ = -(ushort)(auVar54._14_2_ == 0);
    auVar64 = ~auVar64 & auVar31;
    sVar77 = auVar60._0_2_;
    sVar15 = auVar64._0_2_;
    uVar22 = (ushort)(sVar15 < sVar77) * sVar77 | (ushort)(sVar15 >= sVar77) * sVar15;
    sVar77 = auVar60._2_2_;
    sVar15 = auVar64._2_2_;
    uVar24 = (ushort)(sVar15 < sVar77) * sVar77 | (ushort)(sVar15 >= sVar77) * sVar15;
    sVar77 = auVar60._4_2_;
    sVar15 = auVar64._4_2_;
    uVar26 = (ushort)(sVar15 < sVar77) * sVar77 | (ushort)(sVar15 >= sVar77) * sVar15;
    sVar77 = auVar60._6_2_;
    sVar15 = auVar64._6_2_;
    uVar28 = (ushort)(sVar15 < sVar77) * sVar77 | (ushort)(sVar15 >= sVar77) * sVar15;
    sVar77 = auVar60._8_2_;
    sVar15 = auVar64._8_2_;
    uVar55 = (ushort)(sVar15 < sVar77) * sVar77 | (ushort)(sVar15 >= sVar77) * sVar15;
    sVar77 = auVar60._10_2_;
    sVar15 = auVar64._10_2_;
    uVar56 = (ushort)(sVar15 < sVar77) * sVar77 | (ushort)(sVar15 >= sVar77) * sVar15;
    sVar77 = auVar60._12_2_;
    sVar15 = auVar64._12_2_;
    sVar30 = auVar64._14_2_;
    uVar57 = (ushort)(sVar15 < sVar77) * sVar77 | (ushort)(sVar15 >= sVar77) * sVar15;
    sVar77 = auVar60._14_2_;
    uVar58 = (ushort)(sVar30 < sVar77) * sVar77 | (ushort)(sVar30 >= sVar77) * sVar30;
    zbin_ptr = extraout_RDX_00;
  }
  ptVar13 = dqcoeff_ptr + 0x18;
  for (uVar12 = 0x10; uVar12 < 0x400; uVar12 = uVar12 + 0x10) {
    auVar31 = packssdw(*(undefined1 (*) [16])(coeff_ptr + uVar12),
                       *(undefined1 (*) [16])(coeff_ptr + uVar12 + 4));
    auVar64 = packssdw(*(undefined1 (*) [16])(coeff_ptr + uVar12 + 8),
                       *(undefined1 (*) [16])(coeff_ptr + uVar12 + 0xc));
    auVar60 = pabsw(auVar60,auVar31);
    auVar41 = pabsw(auVar41,auVar64);
    uVar14 = (ushort)(sVar67 < auVar60._0_2_);
    auVar68._0_2_ = -uVar14;
    uVar20 = (ushort)(sVar69 < auVar60._2_2_);
    auVar68._2_2_ = -uVar20;
    uVar23 = (ushort)(sVar70 < auVar60._4_2_);
    auVar68._4_2_ = -uVar23;
    uVar27 = (ushort)(sVar71 < auVar60._6_2_);
    auVar68._6_2_ = -uVar27;
    uVar4 = (ushort)(sVar72 < auVar60._8_2_);
    auVar68._8_2_ = -uVar4;
    uVar6 = (ushort)(sVar73 < auVar60._10_2_);
    auVar68._10_2_ = -uVar6;
    uVar8 = (ushort)(sVar74 < auVar60._12_2_);
    auVar68._12_2_ = -uVar8;
    uVar10 = (ushort)(sVar75 < auVar60._14_2_);
    auVar68._14_2_ = -uVar10;
    uVar19 = (ushort)(sVar67 < auVar41._0_2_);
    auVar76._0_2_ = -uVar19;
    uVar21 = (ushort)(sVar69 < auVar41._2_2_);
    auVar76._2_2_ = -uVar21;
    uVar25 = (ushort)(sVar70 < auVar41._4_2_);
    auVar76._4_2_ = -uVar25;
    uVar29 = (ushort)(sVar71 < auVar41._6_2_);
    auVar76._6_2_ = -uVar29;
    uVar5 = (ushort)(sVar72 < auVar41._8_2_);
    auVar76._8_2_ = -uVar5;
    uVar7 = (ushort)(sVar73 < auVar41._10_2_);
    auVar76._10_2_ = -uVar7;
    uVar9 = (ushort)(sVar74 < auVar41._12_2_);
    auVar76._12_2_ = -uVar9;
    uVar11 = (ushort)(sVar75 < auVar41._14_2_);
    auVar76._14_2_ = -uVar11;
    auVar66 = auVar76 | auVar68;
    if ((((((((((((((((auVar66 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar66 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar66 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar66 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar66 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar66 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar66 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar66 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar66 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar66 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar66 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar66 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar66 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar66 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar66 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar66[0xf]) {
      *(undefined1 (*) [16])(qcoeff_ptr + uVar12 + 0xc) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(qcoeff_ptr + uVar12 + 8) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(qcoeff_ptr + uVar12 + 4) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(qcoeff_ptr + uVar12) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(dqcoeff_ptr + uVar12 + 0xc) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(dqcoeff_ptr + uVar12 + 8) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(dqcoeff_ptr + uVar12 + 4) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(dqcoeff_ptr + uVar12) = (undefined1  [16])0x0;
    }
    else {
      auVar66 = paddsw(auVar60,local_68);
      auVar79 = pmulhw(auVar66,local_78);
      auVar80._0_2_ = auVar79._0_2_ + auVar66._0_2_;
      auVar80._2_2_ = auVar79._2_2_ + auVar66._2_2_;
      auVar80._4_2_ = auVar79._4_2_ + auVar66._4_2_;
      auVar80._6_2_ = auVar79._6_2_ + auVar66._6_2_;
      auVar80._8_2_ = auVar79._8_2_ + auVar66._8_2_;
      auVar80._10_2_ = auVar79._10_2_ + auVar66._10_2_;
      auVar80._12_2_ = auVar79._12_2_ + auVar66._12_2_;
      auVar80._14_2_ = auVar79._14_2_ + auVar66._14_2_;
      auVar66 = pmulhw(auVar80,local_88);
      auVar44._0_2_ = (ushort)(auVar80._0_2_ * local_88._0_2_) >> 0xe;
      auVar44._2_2_ = (ushort)(auVar80._2_2_ * local_88._2_2_) >> 0xe;
      auVar44._4_2_ = (ushort)(auVar80._4_2_ * local_88._4_2_) >> 0xe;
      auVar44._6_2_ = (ushort)(auVar80._6_2_ * local_88._6_2_) >> 0xe;
      auVar44._8_2_ = (ushort)(auVar80._8_2_ * local_88._8_2_) >> 0xe;
      auVar44._10_2_ = (ushort)(auVar80._10_2_ * local_88._10_2_) >> 0xe;
      auVar44._12_2_ = (ushort)(auVar80._12_2_ * local_88._12_2_) >> 0xe;
      auVar44._14_2_ = (ushort)(auVar80._14_2_ * local_88._14_2_) >> 0xe;
      auVar60 = psllw(auVar66,2);
      auVar66 = paddsw(auVar41,local_68);
      auVar79 = pmulhw(auVar66,local_78);
      auVar45._0_2_ = auVar79._0_2_ + auVar66._0_2_;
      auVar45._2_2_ = auVar79._2_2_ + auVar66._2_2_;
      auVar45._4_2_ = auVar79._4_2_ + auVar66._4_2_;
      auVar45._6_2_ = auVar79._6_2_ + auVar66._6_2_;
      auVar45._8_2_ = auVar79._8_2_ + auVar66._8_2_;
      auVar45._10_2_ = auVar79._10_2_ + auVar66._10_2_;
      auVar45._12_2_ = auVar79._12_2_ + auVar66._12_2_;
      auVar45._14_2_ = auVar79._14_2_ + auVar66._14_2_;
      auVar66 = pmulhw(auVar45,local_88);
      auVar42._0_2_ = (ushort)(auVar45._0_2_ * local_88._0_2_) >> 0xe;
      auVar42._2_2_ = (ushort)(auVar45._2_2_ * local_88._2_2_) >> 0xe;
      auVar42._4_2_ = (ushort)(auVar45._4_2_ * local_88._4_2_) >> 0xe;
      auVar42._6_2_ = (ushort)(auVar45._6_2_ * local_88._6_2_) >> 0xe;
      auVar42._8_2_ = (ushort)(auVar45._8_2_ * local_88._8_2_) >> 0xe;
      auVar42._10_2_ = (ushort)(auVar45._10_2_ * local_88._10_2_) >> 0xe;
      auVar42._12_2_ = (ushort)(auVar45._12_2_ * local_88._12_2_) >> 0xe;
      auVar42._14_2_ = (ushort)(auVar45._14_2_ * local_88._14_2_) >> 0xe;
      auVar66 = psllw(auVar66,2);
      auVar79 = psignw(auVar60 | auVar44,auVar31);
      auVar66 = psignw(auVar66 | auVar42,auVar64);
      auVar79 = auVar79 & auVar68;
      auVar66 = auVar66 & auVar76;
      auVar64 = psraw(auVar79,0xf);
      auVar35._0_12_ = auVar79._0_12_;
      auVar35._12_2_ = auVar79._6_2_;
      auVar35._14_2_ = auVar64._6_2_;
      auVar34._12_4_ = auVar35._12_4_;
      auVar34._0_10_ = auVar79._0_10_;
      auVar34._10_2_ = auVar64._4_2_;
      auVar33._10_6_ = auVar34._10_6_;
      auVar33._0_8_ = auVar79._0_8_;
      auVar33._8_2_ = auVar79._4_2_;
      auVar32._8_8_ = auVar33._8_8_;
      auVar32._6_2_ = auVar64._2_2_;
      auVar32._4_2_ = auVar79._2_2_;
      auVar32._0_2_ = auVar79._0_2_;
      auVar32._2_2_ = auVar64._0_2_;
      *(undefined1 (*) [16])(qcoeff_ptr + uVar12) = auVar32;
      ptVar2 = qcoeff_ptr + uVar12 + 4;
      *(short *)ptVar2 = auVar79._8_2_;
      *(short *)((long)ptVar2 + 2) = auVar64._8_2_;
      *(short *)(ptVar2 + 1) = auVar79._10_2_;
      *(short *)((long)ptVar2 + 6) = auVar64._10_2_;
      *(short *)(ptVar2 + 2) = auVar79._12_2_;
      *(short *)((long)ptVar2 + 10) = auVar64._12_2_;
      *(short *)(ptVar2 + 3) = auVar79._14_2_;
      *(short *)((long)ptVar2 + 0xe) = auVar64._14_2_;
      auVar64 = psraw(auVar66,0xf);
      auVar39._0_12_ = auVar66._0_12_;
      auVar39._12_2_ = auVar66._6_2_;
      auVar39._14_2_ = auVar64._6_2_;
      auVar38._12_4_ = auVar39._12_4_;
      auVar38._0_10_ = auVar66._0_10_;
      auVar38._10_2_ = auVar64._4_2_;
      auVar37._10_6_ = auVar38._10_6_;
      auVar37._0_8_ = auVar66._0_8_;
      auVar37._8_2_ = auVar66._4_2_;
      auVar36._8_8_ = auVar37._8_8_;
      auVar36._6_2_ = auVar64._2_2_;
      auVar36._4_2_ = auVar66._2_2_;
      auVar36._0_2_ = auVar66._0_2_;
      auVar36._2_2_ = auVar64._0_2_;
      *(undefined1 (*) [16])(qcoeff_ptr + uVar12 + 8) = auVar36;
      ptVar2 = qcoeff_ptr + uVar12 + 0xc;
      *(short *)ptVar2 = auVar66._8_2_;
      *(short *)((long)ptVar2 + 2) = auVar64._8_2_;
      *(short *)(ptVar2 + 1) = auVar66._10_2_;
      *(short *)((long)ptVar2 + 6) = auVar64._10_2_;
      *(short *)(ptVar2 + 2) = auVar66._12_2_;
      *(short *)((long)ptVar2 + 10) = auVar64._12_2_;
      *(short *)(ptVar2 + 3) = auVar66._14_2_;
      *(short *)((long)ptVar2 + 0xe) = auVar64._14_2_;
      qcoeff_01[1] = n_coeffs;
      qcoeff_01[0] = (longlong)(ptVar13 + -8);
      dequant_01[1] = (longlong)round_ptr;
      dequant_01[0] = (longlong)zbin_ptr;
      zero_01[1] = (longlong)quant_shift_ptr;
      zero_01[0] = (longlong)quant_ptr;
      calculate_dqcoeff_and_store_64x64(qcoeff_01,dequant_01,zero_01,dqcoeff);
      qcoeff_02[1] = n_coeffs;
      qcoeff_02[0] = (longlong)ptVar13;
      dequant_02[1] = (longlong)round_ptr;
      dequant_02[0] = extraout_RDX_01;
      zero_02[1] = (longlong)quant_shift_ptr;
      zero_02[0] = (longlong)quant_ptr;
      calculate_dqcoeff_and_store_64x64(qcoeff_02,dequant_02,zero_02,dqcoeff);
      psVar1 = iscan + uVar12;
      psVar3 = iscan + uVar12 + 8;
      auVar16._0_2_ = *psVar1 + uVar14;
      auVar16._2_2_ = psVar1[1] + uVar20;
      auVar16._4_2_ = psVar1[2] + uVar23;
      auVar16._6_2_ = psVar1[3] + uVar27;
      auVar16._8_2_ = psVar1[4] + uVar4;
      auVar16._10_2_ = psVar1[5] + uVar6;
      auVar16._12_2_ = psVar1[6] + uVar8;
      auVar16._14_2_ = psVar1[7] + uVar10;
      auVar31._0_2_ = *psVar3 + uVar19;
      auVar31._2_2_ = psVar3[1] + uVar21;
      auVar31._4_2_ = psVar3[2] + uVar25;
      auVar31._6_2_ = psVar3[3] + uVar29;
      auVar31._8_2_ = psVar3[4] + uVar5;
      auVar31._10_2_ = psVar3[5] + uVar7;
      auVar31._12_2_ = psVar3[6] + uVar9;
      auVar31._14_2_ = psVar3[7] + uVar11;
      auVar41 = (undefined1  [16])0x0;
      auVar46._0_2_ = -(ushort)(auVar32._0_2_ == 0);
      auVar46._2_2_ = -(ushort)(auVar79._2_2_ == 0);
      auVar46._4_2_ = -(ushort)(auVar79._4_2_ == 0);
      auVar46._6_2_ = -(ushort)(auVar79._6_2_ == 0);
      auVar46._8_2_ = -(ushort)(auVar79._8_2_ == 0);
      auVar46._10_2_ = -(ushort)(auVar79._10_2_ == 0);
      auVar46._12_2_ = -(ushort)(auVar79._12_2_ == 0);
      auVar46._14_2_ = -(ushort)(auVar79._14_2_ == 0);
      auVar60 = ~auVar46 & auVar16;
      auVar17._0_2_ = -(ushort)(auVar36._0_2_ == 0);
      auVar17._2_2_ = -(ushort)(auVar66._2_2_ == 0);
      auVar17._4_2_ = -(ushort)(auVar66._4_2_ == 0);
      auVar17._6_2_ = -(ushort)(auVar66._6_2_ == 0);
      auVar17._8_2_ = -(ushort)(auVar66._8_2_ == 0);
      auVar17._10_2_ = -(ushort)(auVar66._10_2_ == 0);
      auVar17._12_2_ = -(ushort)(auVar66._12_2_ == 0);
      auVar17._14_2_ = -(ushort)(auVar66._14_2_ == 0);
      auVar64 = ~auVar17 & auVar31;
      sVar77 = auVar60._0_2_;
      sVar15 = auVar64._0_2_;
      uVar14 = (ushort)(sVar15 < sVar77) * sVar77 | (ushort)(sVar15 >= sVar77) * sVar15;
      sVar77 = auVar60._2_2_;
      sVar15 = auVar64._2_2_;
      uVar19 = (ushort)(sVar15 < sVar77) * sVar77 | (ushort)(sVar15 >= sVar77) * sVar15;
      sVar77 = auVar60._4_2_;
      sVar15 = auVar64._4_2_;
      uVar20 = (ushort)(sVar15 < sVar77) * sVar77 | (ushort)(sVar15 >= sVar77) * sVar15;
      sVar77 = auVar60._6_2_;
      sVar15 = auVar64._6_2_;
      uVar21 = (ushort)(sVar15 < sVar77) * sVar77 | (ushort)(sVar15 >= sVar77) * sVar15;
      sVar77 = auVar60._8_2_;
      sVar15 = auVar64._8_2_;
      uVar23 = (ushort)(sVar15 < sVar77) * sVar77 | (ushort)(sVar15 >= sVar77) * sVar15;
      sVar77 = auVar60._10_2_;
      sVar15 = auVar64._10_2_;
      uVar25 = (ushort)(sVar15 < sVar77) * sVar77 | (ushort)(sVar15 >= sVar77) * sVar15;
      sVar77 = auVar60._12_2_;
      sVar15 = auVar64._12_2_;
      sVar30 = auVar64._14_2_;
      uVar27 = (ushort)(sVar15 < sVar77) * sVar77 | (ushort)(sVar15 >= sVar77) * sVar15;
      sVar77 = auVar60._14_2_;
      uVar29 = (ushort)(sVar30 < sVar77) * sVar77 | (ushort)(sVar30 >= sVar77) * sVar30;
      uVar22 = ((short)uVar22 < (short)uVar14) * uVar14 | ((short)uVar22 >= (short)uVar14) * uVar22;
      uVar24 = ((short)uVar24 < (short)uVar19) * uVar19 | ((short)uVar24 >= (short)uVar19) * uVar24;
      uVar26 = ((short)uVar26 < (short)uVar20) * uVar20 | ((short)uVar26 >= (short)uVar20) * uVar26;
      uVar28 = ((short)uVar28 < (short)uVar21) * uVar21 | ((short)uVar28 >= (short)uVar21) * uVar28;
      uVar55 = ((short)uVar55 < (short)uVar23) * uVar23 | ((short)uVar55 >= (short)uVar23) * uVar55;
      uVar56 = ((short)uVar56 < (short)uVar25) * uVar25 | ((short)uVar56 >= (short)uVar25) * uVar56;
      uVar57 = ((short)uVar57 < (short)uVar27) * uVar27 | ((short)uVar57 >= (short)uVar27) * uVar57;
      uVar58 = ((short)uVar58 < (short)uVar29) * uVar29 | ((short)uVar58 >= (short)uVar29) * uVar58;
      zbin_ptr = extraout_RDX_02;
    }
    ptVar13 = ptVar13 + 0x10;
  }
  auVar18._0_2_ =
       ((short)uVar55 < (short)uVar22) * uVar22 | ((short)uVar55 >= (short)uVar22) * uVar55;
  auVar18._2_2_ =
       ((short)uVar56 < (short)uVar24) * uVar24 | ((short)uVar56 >= (short)uVar24) * uVar56;
  auVar18._4_2_ =
       ((short)uVar57 < (short)uVar26) * uVar26 | ((short)uVar57 >= (short)uVar26) * uVar57;
  auVar18._6_2_ =
       ((short)uVar58 < (short)uVar28) * uVar28 | ((short)uVar58 >= (short)uVar28) * uVar58;
  auVar18._8_2_ =
       ((short)uVar22 < (short)uVar55) * uVar55 | ((short)uVar22 >= (short)uVar55) * uVar22;
  auVar18._10_2_ =
       ((short)uVar24 < (short)uVar56) * uVar56 | ((short)uVar24 >= (short)uVar56) * uVar24;
  auVar18._12_2_ =
       ((short)uVar22 < (short)uVar57) * uVar57 | ((short)uVar22 >= (short)uVar57) * uVar22;
  auVar18._14_2_ =
       ((short)uVar24 < (short)uVar58) * uVar58 | ((short)uVar24 >= (short)uVar58) * uVar24;
  auVar64 = pshuflw(auVar31,auVar18,0xe);
  sVar67 = auVar64._0_2_;
  auVar40._0_2_ =
       (sVar67 < (short)auVar18._0_2_) * auVar18._0_2_ |
       (ushort)(sVar67 >= (short)auVar18._0_2_) * sVar67;
  sVar67 = auVar64._2_2_;
  auVar40._2_2_ =
       (sVar67 < (short)auVar18._2_2_) * auVar18._2_2_ |
       (ushort)(sVar67 >= (short)auVar18._2_2_) * sVar67;
  sVar67 = auVar64._4_2_;
  auVar40._4_2_ =
       (sVar67 < (short)auVar18._4_2_) * auVar18._4_2_ |
       (ushort)(sVar67 >= (short)auVar18._4_2_) * sVar67;
  sVar67 = auVar64._6_2_;
  auVar40._6_2_ =
       (sVar67 < (short)auVar18._6_2_) * auVar18._6_2_ |
       (ushort)(sVar67 >= (short)auVar18._6_2_) * sVar67;
  sVar67 = auVar64._8_2_;
  auVar40._8_2_ =
       (sVar67 < (short)auVar18._8_2_) * auVar18._8_2_ |
       (ushort)(sVar67 >= (short)auVar18._8_2_) * sVar67;
  sVar67 = auVar64._10_2_;
  auVar40._10_2_ =
       (sVar67 < (short)auVar18._10_2_) * auVar18._10_2_ |
       (ushort)(sVar67 >= (short)auVar18._10_2_) * sVar67;
  sVar67 = auVar64._12_2_;
  sVar69 = auVar64._14_2_;
  auVar40._12_2_ =
       (sVar67 < (short)auVar18._12_2_) * auVar18._12_2_ |
       (ushort)(sVar67 >= (short)auVar18._12_2_) * sVar67;
  auVar40._14_2_ =
       (sVar69 < (short)auVar18._14_2_) * auVar18._14_2_ |
       (ushort)(sVar69 >= (short)auVar18._14_2_) * sVar69;
  auVar64 = pshuflw(auVar18,auVar40,1);
  sVar67 = auVar64._2_2_;
  *eob_ptr = (sVar67 < (short)auVar40._2_2_) * auVar40._2_2_ |
             (ushort)(sVar67 >= (short)auVar40._2_2_) * sVar67;
  return;
}

Assistant:

void aom_quantize_b_64x64_ssse3(const tran_low_t *coeff_ptr, intptr_t n_coeffs,
                                const int16_t *zbin_ptr,
                                const int16_t *round_ptr,
                                const int16_t *quant_ptr,
                                const int16_t *quant_shift_ptr,
                                tran_low_t *qcoeff_ptr, tran_low_t *dqcoeff_ptr,
                                const int16_t *dequant_ptr, uint16_t *eob_ptr,
                                const int16_t *scan, const int16_t *iscan) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i one = _mm_set1_epi16(1);
  const __m128i two = _mm_set1_epi16(2);
  int index;

  __m128i zbin, round, quant, dequant, shift;
  __m128i coeff0, coeff1, qcoeff0, qcoeff1;
  __m128i cmp_mask0, cmp_mask1, all_zero;
  __m128i eob = zero, eob0;

  (void)scan;
  (void)n_coeffs;

  // Setup global values.
  zbin = _mm_load_si128((const __m128i *)zbin_ptr);
  round = _mm_load_si128((const __m128i *)round_ptr);
  quant = _mm_load_si128((const __m128i *)quant_ptr);
  dequant = _mm_load_si128((const __m128i *)dequant_ptr);
  shift = _mm_load_si128((const __m128i *)quant_shift_ptr);

  // Shift with rounding.
  zbin = _mm_add_epi16(zbin, two);
  round = _mm_add_epi16(round, two);
  zbin = _mm_srli_epi16(zbin, 2);
  round = _mm_srli_epi16(round, 2);
  zbin = _mm_sub_epi16(zbin, one);
  // Do DC and first 15 AC.
  coeff0 = load_coefficients(coeff_ptr);
  coeff1 = load_coefficients(coeff_ptr + 8);

  qcoeff0 = _mm_abs_epi16(coeff0);
  qcoeff1 = _mm_abs_epi16(coeff1);

  cmp_mask0 = _mm_cmpgt_epi16(qcoeff0, zbin);
  zbin = _mm_unpackhi_epi64(zbin, zbin);
  cmp_mask1 = _mm_cmpgt_epi16(qcoeff1, zbin);
  all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
  if (_mm_movemask_epi8(all_zero) == 0) {
    _mm_store_si128((__m128i *)(qcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 4), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 8), zero);
    _mm_store_si128((__m128i *)(qcoeff_ptr + 12), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 4), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 8), zero);
    _mm_store_si128((__m128i *)(dqcoeff_ptr + 12), zero);
    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
  } else {
    calculate_qcoeff_64x64(&qcoeff0, round, quant, &shift);
    round = _mm_unpackhi_epi64(round, round);
    quant = _mm_unpackhi_epi64(quant, quant);
    shift = _mm_unpackhi_epi64(shift, shift);
    calculate_qcoeff_64x64(&qcoeff1, round, quant, &shift);

    // Reinsert signs.
    qcoeff0 = _mm_sign_epi16(qcoeff0, coeff0);
    qcoeff1 = _mm_sign_epi16(qcoeff1, coeff1);

    // Mask out zbin threshold coeffs.
    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    store_coefficients(qcoeff0, qcoeff_ptr);
    store_coefficients(qcoeff1, qcoeff_ptr + 8);

    calculate_dqcoeff_and_store_64x64(qcoeff0, dequant, zero, dqcoeff_ptr);
    dequant = _mm_unpackhi_epi64(dequant, dequant);
    calculate_dqcoeff_and_store_64x64(qcoeff1, dequant, zero, dqcoeff_ptr + 8);

    eob =
        scan_for_eob(&qcoeff0, &qcoeff1, cmp_mask0, cmp_mask1, iscan, 0, zero);
  }

  // AC only loop.
  for (index = 16; index < 1024; index += 16) {
    coeff0 = load_coefficients(coeff_ptr + index);
    coeff1 = load_coefficients(coeff_ptr + index + 8);

    qcoeff0 = _mm_abs_epi16(coeff0);
    qcoeff1 = _mm_abs_epi16(coeff1);

    cmp_mask0 = _mm_cmpgt_epi16(qcoeff0, zbin);
    cmp_mask1 = _mm_cmpgt_epi16(qcoeff1, zbin);

    all_zero = _mm_or_si128(cmp_mask0, cmp_mask1);
    if (_mm_movemask_epi8(all_zero) == 0) {
      _mm_store_si128((__m128i *)(qcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 4), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 8), zero);
      _mm_store_si128((__m128i *)(qcoeff_ptr + index + 12), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 4), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 8), zero);
      _mm_store_si128((__m128i *)(dqcoeff_ptr + index + 12), zero);
      continue;
    }
    calculate_qcoeff_64x64(&qcoeff0, round, quant, &shift);
    calculate_qcoeff_64x64(&qcoeff1, round, quant, &shift);

    qcoeff0 = _mm_sign_epi16(qcoeff0, coeff0);
    qcoeff1 = _mm_sign_epi16(qcoeff1, coeff1);

    qcoeff0 = _mm_and_si128(qcoeff0, cmp_mask0);
    qcoeff1 = _mm_and_si128(qcoeff1, cmp_mask1);

    store_coefficients(qcoeff0, qcoeff_ptr + index);
    store_coefficients(qcoeff1, qcoeff_ptr + index + 8);

    calculate_dqcoeff_and_store_64x64(qcoeff0, dequant, zero,
                                      dqcoeff_ptr + index);
    calculate_dqcoeff_and_store_64x64(qcoeff1, dequant, zero,
                                      dqcoeff_ptr + 8 + index);

    eob0 = scan_for_eob(&qcoeff0, &qcoeff1, cmp_mask0, cmp_mask1, iscan, index,
                        zero);
    eob = _mm_max_epi16(eob, eob0);
  }

  *eob_ptr = accumulate_eob(eob);
}